

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<true>::nameSpace(TC_parser<true> *this)

{
  size_t sVar1;
  char *pcVar2;
  TC_parser<true> *in_RDI;
  uint64_t in_stack_00000020;
  size_t in_stack_00000028;
  TC_parser<true> *in_stack_00000030;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  char *in_stack_000000d8;
  TC_parser<true> *in_stack_000000e0;
  size_t in_stack_000001b8;
  uchar *in_stack_ffffffffffffffe8;
  
  in_RDI->cur_channel_v = 1.0;
  in_RDI->index = '\0';
  in_RDI->new_index = false;
  in_RDI->anon = 0;
  if ((((*in_RDI->reading_head == ' ') || (*in_RDI->reading_head == '\t')) ||
      (in_RDI->reading_head == in_RDI->endLine)) ||
     ((*in_RDI->reading_head == '|' || (*in_RDI->reading_head == '\r')))) {
    in_RDI->index = ' ';
    sVar1 = features::size((features *)0x3d4a53);
    if (sVar1 == 0) {
      in_RDI->new_index = true;
    }
    if (in_RDI->base != (char *)0x0) {
      free(in_RDI->base);
    }
    pcVar2 = calloc_or_throw<char>(in_stack_000001b8);
    in_RDI->base = pcVar2;
    *in_RDI->base = ' ';
    in_RDI->base[1] = '\0';
    if (in_RDI->hash_seed == 0) {
      in_stack_ffffffffffffffe8 = (uchar *)0x0;
    }
    else {
      in_stack_ffffffffffffffe8 =
           (uchar *)uniform_hash(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    }
    in_RDI->channel_hash = (uint64_t)in_stack_ffffffffffffffe8;
    listFeatures(in_RDI);
  }
  else if (*in_RDI->reading_head == ':') {
    parserWarning(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                  in_stack_000000c0);
  }
  else {
    nameSpaceInfo(in_stack_00000030);
    listFeatures(in_RDI);
  }
  if (((in_RDI->new_index & 1U) != 0) && (sVar1 = features::size((features *)0x3d4b57), sVar1 != 0))
  {
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)in_RDI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

inline void nameSpace()
  {
    cur_channel_v = 1.0;
    index = 0;
    new_index = false;
    anon = 0;
    if (*reading_head == ' ' || *reading_head == '\t' || reading_head == endLine || *reading_head == '|' ||
        *reading_head == '\r')
    {
      // NameSpace --> ListFeatures
      index = (unsigned char)' ';
      if (ae->feature_space[index].size() == 0)
        new_index = true;
      if (audit)
      {
        if (base != nullptr)
          free(base);
        base = calloc_or_throw<char>(2);
        base[0] = ' ';
        base[1] = '\0';
      }
      channel_hash = this->hash_seed == 0 ? 0 : uniform_hash("", 0, this->hash_seed);
      listFeatures();
    }
    else if (*reading_head != ':')
    {
      // NameSpace --> NameSpaceInfo ListFeatures
      nameSpaceInfo();
      listFeatures();
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|',String,space, or EOL expected after : \"", beginLine, reading_head, "\"");
    }
    if (new_index && ae->feature_space[index].size() > 0)
      ae->indices.push_back(index);
  }